

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmLocalNinjaGenerator::WritePools(cmLocalNinjaGenerator *this,ostream *os)

{
  cmState *this_00;
  int iVar1;
  char *pcVar2;
  long lVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  string pool;
  uint jobs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pools;
  string local_90;
  undefined1 local_6c [4];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  allocator local_50 [32];
  
  cmGlobalNinjaGenerator::WriteDivider(os);
  this_00 = ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
            CMakeInstance->State;
  std::__cxx11::string::string((string *)&local_90,"JOB_POOLS",local_50);
  pcVar2 = cmState::GetGlobalProperty(this_00,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::string
              ((string *)&local_90,"Pools defined by global property JOB_POOLS",local_50);
    cmGlobalNinjaGenerator::WriteComment(os,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&local_90,pcVar2,local_50);
    cmSystemTools::ExpandListArgument(&local_90,&local_68,false);
    std::__cxx11::string::~string((string *)&local_90);
    lVar5 = 0;
    uVar6 = 0;
    while( true ) {
      if ((ulong)((long)local_68.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_68.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar6) break;
      std::__cxx11::string::string
                ((string *)&local_90,
                 (string *)
                 ((long)&((local_68.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5));
      lVar3 = std::__cxx11::string::find((char *)&local_90,0x565367);
      if (lVar3 == -1) {
LAB_00384f52:
        cmSystemTools::Error
                  ("Invalid pool defined by property \'JOB_POOLS\': ",local_90._M_dataplus._M_p,
                   (char *)0x0,(char *)0x0);
      }
      else {
        iVar1 = __isoc99_sscanf(local_90._M_dataplus._M_p + lVar3,"=%u",local_6c);
        if (iVar1 != 1) goto LAB_00384f52;
        poVar4 = std::operator<<(os,"pool ");
        std::__cxx11::string::substr((ulong)local_50,(ulong)&local_90);
        poVar4 = std::operator<<(poVar4,(string *)local_50);
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::string::~string((string *)local_50);
        poVar4 = std::operator<<(os,"  depth = ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        std::endl<char,std::char_traits<char>>(poVar4);
        std::endl<char,std::char_traits<char>>(os);
      }
      std::__cxx11::string::~string((string *)&local_90);
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x20;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
  }
  return;
}

Assistant:

void cmLocalNinjaGenerator::WritePools(std::ostream& os)
{
  cmGlobalNinjaGenerator::WriteDivider(os);

  const char* jobpools = this->GetCMakeInstance()->GetState()
                             ->GetGlobalProperty("JOB_POOLS");
  if (jobpools)
    {
    cmGlobalNinjaGenerator::WriteComment(os,
                            "Pools defined by global property JOB_POOLS");
    std::vector<std::string> pools;
    cmSystemTools::ExpandListArgument(jobpools, pools);
    for (size_t i = 0; i < pools.size(); ++i)
      {
      const std::string pool = pools[i];
      const std::string::size_type eq = pool.find("=");
      unsigned int jobs;
      if (eq != std::string::npos &&
          sscanf(pool.c_str() + eq, "=%u", &jobs) == 1)
        {
        os << "pool " << pool.substr(0, eq) << std::endl;
        os << "  depth = " << jobs << std::endl;
        os << std::endl;
        }
      else
        {
        cmSystemTools::Error("Invalid pool defined by property 'JOB_POOLS': ",
                             pool.c_str());
        }
      }
    }
}